

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobjectdefs.h
# Opt level: O0

void QMetaObject::activate<void,bool>
               (QObject *sender,QMetaObject *mo,int local_signal_index,void *ret,bool *args)

{
  long lVar1;
  QMetaObject *in_RCX;
  undefined4 in_EDX;
  undefined8 in_R8;
  long in_FS_OFFSET;
  void *_a [2];
  void **in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  activate((QObject *)CONCAT44(in_EDX,in_stack_ffffffffffffffd0),in_RCX,(int)((ulong)in_R8 >> 0x20),
           in_stack_ffffffffffffffb8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static inline void
    activate(QObject *sender, const QMetaObject *mo, int local_signal_index, Ret *ret, const Args &... args)
    {
        void *_a[] = {
            const_cast<void *>(reinterpret_cast<const volatile void *>(ret)),
            const_cast<void *>(reinterpret_cast<const volatile void *>(std::addressof(args)))...
        };
        activate(sender, mo, local_signal_index, _a);
    }